

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_show_aqr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  REF_DBL *pRVar4;
  REF_DBL *local_48;
  
  uVar1 = (ulong)(uint)n;
  if (a != (REF_DBL *)0x0) {
    puts("A");
    if (m < 1) {
      puts("Q");
      goto LAB_00129a5d;
    }
    uVar3 = 0;
    do {
      uVar2 = uVar1;
      pRVar4 = a;
      if (0 < n) {
        do {
          printf(" %12.4e",*pRVar4);
          uVar2 = uVar2 - 1;
          pRVar4 = pRVar4 + (uint)m;
        } while (uVar2 != 0);
      }
      putchar(10);
      uVar3 = uVar3 + 1;
      a = a + 1;
    } while (uVar3 != (uint)m);
  }
  puts("Q");
  if (0 < m) {
    uVar3 = 0;
    local_48 = q;
    do {
      uVar2 = uVar1;
      pRVar4 = local_48;
      if (0 < n) {
        do {
          printf(" %12.4e",*pRVar4);
          uVar2 = uVar2 - 1;
          pRVar4 = pRVar4 + (uint)m;
        } while (uVar2 != 0);
      }
      putchar(10);
      uVar3 = uVar3 + 1;
      local_48 = local_48 + 1;
    } while (uVar3 != (uint)m);
  }
LAB_00129a5d:
  puts("R");
  if (0 < n) {
    uVar2 = 0;
    uVar3 = uVar1;
    pRVar4 = r;
    do {
      do {
        printf(" %12.4e",*r);
        r = r + uVar1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      putchar(10);
      uVar2 = uVar2 + 1;
      r = pRVar4 + 1;
      uVar3 = uVar1;
      pRVar4 = r;
    } while (uVar2 != uVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_aqr(REF_INT m, REF_INT n, REF_DBL *a,
                                       REF_DBL *q, REF_DBL *r) {
  REF_INT row, col;

  if (NULL != a) {
    printf("A\n");
    for (row = 0; row < m; row++) {
      for (col = 0; col < n; col++) {
        printf(" %12.4e", a[row + m * col]);
      }
      printf("\n");
    }
  }
  printf("Q\n");
  for (row = 0; row < m; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", q[row + m * col]);
    }
    printf("\n");
  }
  printf("R\n");
  for (row = 0; row < n; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", r[row + n * col]);
    }
    printf("\n");
  }

  return REF_SUCCESS;
}